

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

ostream * __thiscall nivalis::DrawBufferObject::to_bin(DrawBufferObject *this,ostream *os)

{
  size_t *psVar1;
  pointer paVar2;
  int i;
  long lVar3;
  ulong uVar4;
  size_t local_38;
  size_t sStack_30;
  
  local_38 = (long)(this->points).
                   super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->points).
                   super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
  std::ostream::write((char *)os,(long)&local_38);
  paVar2 = (this->points).
           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->points).
      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl
      .super__Vector_impl_data._M_finish != paVar2) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      psVar1 = (size_t *)((long)paVar2->_M_elems + lVar3);
      local_38 = *psVar1;
      sStack_30 = psVar1[1];
      std::ostream::write((char *)os,(long)&local_38);
      uVar4 = uVar4 + 1;
      paVar2 = (this->points).
               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < (ulong)((long)(this->points).
                                   super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2 >> 4));
  }
  local_38 = CONCAT44(local_38._4_4_,this->thickness);
  std::ostream::write((char *)os,(long)&local_38);
  lVar3 = 0;
  do {
    local_38 = CONCAT44(local_38._4_4_,(this->c).data[lVar3]);
    std::ostream::write((char *)os,(long)&local_38);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  local_38 = this->rel_func;
  std::ostream::write((char *)os,(long)&local_38);
  local_38 = CONCAT44(local_38._4_4_,this->type);
  std::ostream::write((char *)os,(long)&local_38);
  local_38 = (this->str)._M_string_length;
  std::ostream::write((char *)os,(long)&local_38);
  std::ostream::write((char *)os,(long)(this->str)._M_dataplus._M_p);
  return os;
}

Assistant:

std::ostream& DrawBufferObject::to_bin(std::ostream& os) const {
    util::write_bin(os, points.size());
    for (size_t i = 0; i < points.size(); ++i) {
        util::write_bin(os, points[i]);
    }
    util::write_bin(os, thickness);
    for (int i = 0; i < 4; ++i) util::write_bin(os, c.data[i]);
    util::write_bin(os, rel_func);
    util::write_bin(os, type);
    util::write_bin(os, str.size());
    os.write(str.c_str(), str.size());
    return os;
}